

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O3

void __thiscall
test::syntax_tests::iu_SyntaxTest_x_iutest_x_VariadicPred_Test::Body
          (iu_SyntaxTest_x_iutest_x_VariadicPred_Test *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int in_stack_fffffffffffffe08;
  allocator<char> local_1f1;
  AssertionResult iutest_ar;
  AssertionHelper local_1c8;
  undefined1 local_198 [392];
  
  iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
            (&iutest_ar,(iutest *)"PredTest6","0, x, 2, 3, 4, 5",(char *)PredTest6,
             (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,in_stack_fffffffffffffe08);
  if (iutest_ar.m_result == false) {
    memset((iu_global_format_stringstream *)local_198,0,0x188);
    iutest::iu_global_format_stringstream::iu_global_format_stringstream
              ((iu_global_format_stringstream *)local_198);
    local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 1;
    iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(int *)&local_1c8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_1c8,iutest_ar.m_message._M_dataplus._M_p,&local_1f1);
    local_1c8.m_part_result.super_iuCodeMessage.m_file =
         "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
    ;
    local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x319;
    local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 2;
    iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                    local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_) !=
        &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
      operator_delete((undefined1 *)
                      CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._4_4_,
                               local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                               _M_p._0_4_),
                      local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                      _M_allocated_capacity + 1);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p == &iutest_ar.m_message.field_2) {
      return;
    }
  }
  else {
    paVar1 = &iutest_ar.m_message.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              (&iutest_ar,(iutest *)"PredTest6","0, x, 2, 3, 4, 5",(char *)PredTest6,
               (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,in_stack_fffffffffffffe08);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 1;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(int *)&local_1c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,iutest_ar.m_message._M_dataplus._M_p,&local_1f1);
      local_1c8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x31b;
      local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 1;
      iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              (&iutest_ar,(iutest *)"PredTest6","0, x, 2, 3, 4, 5",(char *)PredTest6,
               (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,in_stack_fffffffffffffe08);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 1;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(int *)&local_1c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,iutest_ar.m_message._M_dataplus._M_p,&local_1f1);
      local_1c8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1c8.m_part_result.super_iuCodeMessage.m_line = 0x31d;
      local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 0xffffffff;
      iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p != paVar1) {
      operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                      iutest_ar.m_message.field_2._M_allocated_capacity + 1);
    }
    iutest::AssertPredVariadicHelper<bool(*)(int,int,int,int,int,int),int,int,int,int,int,int>
              (&iutest_ar,(iutest *)"PredTest6","0, x, 2, 3, 4, 5",(char *)PredTest6,
               (_func_bool_int_int_int_int_int_int *)0x0,1,2,3,4,5,in_stack_fffffffffffffe08);
    if (iutest_ar.m_result == false) {
      memset((iu_global_format_stringstream *)local_198,0,0x188);
      iutest::iu_global_format_stringstream::iu_global_format_stringstream
                ((iu_global_format_stringstream *)local_198);
      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_ = 1;
      iutest::detail::iuStreamMessage::operator<<((iuStreamMessage *)local_198,(int *)&local_1c8);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1c8,iutest_ar.m_message._M_dataplus._M_p,&local_1f1);
      local_1c8.m_part_result.super_iuCodeMessage.m_file =
           "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
      ;
      local_1c8.m_part_result.super_iuCodeMessage.m_line = 799;
      local_1c8.m_part_result.super_iuCodeMessage._44_4_ = 0xfffffffd;
      iutest::AssertionHelper::OnFixed(&local_1c8,(Fixed *)local_198,false);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._4_4_,
                      local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus._M_p._0_4_)
          != &local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2) {
        operator_delete((undefined1 *)
                        CONCAT44(local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._4_4_,
                                 local_1c8.m_part_result.super_iuCodeMessage.m_message._M_dataplus.
                                 _M_p._0_4_),
                        local_1c8.m_part_result.super_iuCodeMessage.m_message.field_2.
                        _M_allocated_capacity + 1);
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)local_198);
      std::ios_base::~ios_base((ios_base *)(local_198 + 0x80));
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)iutest_ar.m_message._M_dataplus._M_p == paVar1) {
      return;
    }
  }
  operator_delete(iutest_ar.m_message._M_dataplus._M_p,
                  iutest_ar.m_message.field_2._M_allocated_capacity + 1);
  return;
}

Assistant:

IUTEST(SyntaxTest, VariadicPred)
{
    if( int x=1 )
        IUTEST_ASSERT_PRED(PredTest6, 0, x, 2, 3, 4, 5) << x;
    if( int x=1 )
        IUTEST_EXPECT_PRED(PredTest6, 0, x, 2, 3, 4, 5) << x;
    if( int x=1 )
        IUTEST_INFORM_PRED(PredTest6, 0, x, 2, 3, 4, 5) << x;
    if( int x=1 )
        IUTEST_ASSUME_PRED(PredTest6, 0, x, 2, 3, 4, 5) << x;
}